

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void update_vertex_color_shader(float t,float *vertex_colors)

{
  double dVar1;
  int local_1c;
  int i;
  float *vertex_colors_local;
  float t_local;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    dVar1 = sin((double)(t + (float)local_1c));
    vertex_colors[local_1c] = (float)(((dVar1 + 1.0) * 0.5) / 2.0 + 0.5);
    dVar1 = sin((double)(t + (float)(local_1c + 1)));
    vertex_colors[local_1c + 1] = (float)(((dVar1 + 1.0) * 0.5) / 2.0 + 0.5);
    dVar1 = sin((double)(t + (float)(local_1c + 2)));
    vertex_colors[local_1c + 2] = (float)(((dVar1 + 1.0) * 0.5) / 2.0 + 0.5);
    vertex_colors[local_1c + 3] = 1.0;
  }
  return;
}

Assistant:

void update_vertex_color_shader(float t, float vertex_colors[24])
{
    for(int i = 0; i < 6; ++i)
    {
        vertex_colors[i] = 0.5f + 0.5f*(1 + sin(t + (i)))/2;
        vertex_colors[i+1] = 0.5f + 0.5f*(1 + sin(t + (i+1)))/2;
        vertex_colors[i+2] = 0.5f + 0.5f*(1 + sin(t + (i+2)))/2;
        vertex_colors[i+3] = 1.0f;
    }
}